

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_priority_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *field_value,
              size_t field_value_len)

{
  nghttp2_mem *mem_00;
  uint8_t *puVar1;
  nghttp2_outbound_item *item_00;
  int rv;
  nghttp2_ext_priority_update *priority_update;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  uint8_t *p;
  uint8_t *buf;
  nghttp2_mem *mem;
  size_t field_value_len_local;
  uint8_t *field_value_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  mem_00 = &session->mem;
  if (session->server == '\0') {
    if ((session->remote_settings).no_rfc7540_priorities == 0) {
      session_local._4_4_ = 0;
    }
    else if ((stream_id == 0) || (0x4000 < field_value_len + 4)) {
      session_local._4_4_ = -0x1f5;
    }
    else {
      if (field_value_len == 0) {
        p = (uint8_t *)0x0;
      }
      else {
        p = (uint8_t *)nghttp2_mem_malloc(mem_00,field_value_len + 1);
        if (p == (uint8_t *)0x0) {
          return -0x385;
        }
        puVar1 = nghttp2_cpymem(p,field_value,field_value_len);
        *puVar1 = '\0';
      }
      item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem_00,0x98);
      if (item_00 == (nghttp2_outbound_item *)0x0) {
        free(p);
        session_local._4_4_ = -0x385;
      }
      else {
        nghttp2_outbound_item_init(item_00);
        (item_00->aux_data).goaway.flags = '\x01';
        (item_00->frame).ext.payload = &item_00->ext_frame_payload;
        nghttp2_frame_priority_update_init((nghttp2_extension *)item_00,stream_id,p,field_value_len)
        ;
        session_local._4_4_ = nghttp2_session_add_item(session,item_00);
        if (session_local._4_4_ == 0) {
          session_local._4_4_ = 0;
        }
        else {
          nghttp2_frame_priority_update_free((nghttp2_extension *)item_00,mem_00);
          nghttp2_mem_free(mem_00,item_00);
        }
      }
    }
  }
  else {
    session_local._4_4_ = -0x207;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_priority_update(nghttp2_session *session, uint8_t flags,
                                   int32_t stream_id,
                                   const uint8_t *field_value,
                                   size_t field_value_len) {
  nghttp2_mem *mem;
  uint8_t *buf, *p;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_priority_update *priority_update;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->remote_settings.no_rfc7540_priorities == 0) {
    return 0;
  }

  if (stream_id == 0 || 4 + field_value_len > NGHTTP2_MAX_PAYLOADLEN) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (field_value_len) {
    buf = nghttp2_mem_malloc(mem, field_value_len + 1);
    if (buf == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    p = nghttp2_cpymem(buf, field_value, field_value_len);
    *p = '\0';
  } else {
    buf = NULL;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  priority_update = &item->ext_frame_payload.priority_update;

  frame = &item->frame;
  frame->ext.payload = priority_update;

  nghttp2_frame_priority_update_init(&frame->ext, stream_id, buf,
                                     field_value_len);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_priority_update_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(buf);

  return rv;
}